

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

char fsnav_init_gnss_gps(fsnav_gnss_gps *gps,size_t max_sat_count,size_t max_eph_count)

{
  fsnav_gnss_sat *pfVar1;
  double *pdVar2;
  ulong local_30;
  size_t i;
  size_t max_eph_count_local;
  size_t max_sat_count_local;
  fsnav_gnss_gps *gps_local;
  
  gps->sat = (fsnav_gnss_sat *)0x0;
  gps->max_sat_count = 0;
  gps->max_eph_count = 0;
  pfVar1 = (fsnav_gnss_sat *)calloc(max_sat_count,0x90);
  gps->sat = pfVar1;
  if (gps->sat == (fsnav_gnss_sat *)0x0) {
    gps_local._7_1_ = '\0';
  }
  else {
    gps->max_sat_count = max_sat_count;
    for (local_30 = 0; local_30 < gps->max_sat_count; local_30 = local_30 + 1) {
      fsnav_init_gnss_sat(gps->sat + local_30);
    }
    for (local_30 = 0; local_30 < gps->max_sat_count; local_30 = local_30 + 1) {
      pdVar2 = (double *)calloc(max_eph_count,8);
      gps->sat[local_30].eph = pdVar2;
      if (gps->sat[local_30].eph == (double *)0x0) {
        return '\0';
      }
    }
    gps->max_eph_count = max_eph_count;
    gps->obs_types = (char (*) [4])0x0;
    gps->obs_count = 0;
    gps->iono_valid = '\0';
    gps->clock_corr_valid = '\0';
    gps_local._7_1_ = '\x01';
  }
  return gps_local._7_1_;
}

Assistant:

char fsnav_init_gnss_gps(fsnav_gnss_gps* gps, const size_t max_sat_count, const size_t max_eph_count)
{
	size_t i;

	gps->sat = NULL;
	gps->max_sat_count = 0;
	gps->max_eph_count = 0;

	// try to allocate memory for satellite data
	gps->sat = (fsnav_gnss_sat*)calloc(max_sat_count, sizeof(fsnav_gnss_sat));
	if (gps->sat == NULL)
		return 0;
	gps->max_sat_count = max_sat_count;

	// initialize satellite data
	for (i = 0; i < gps->max_sat_count; i++) 
		fsnav_init_gnss_sat(gps->sat + i);

	// try to allocate memory for each satellite ephemeris
	for (i = 0; i < gps->max_sat_count; i++) {
		gps->sat[i].eph = (double*)calloc(max_eph_count, sizeof(double));
		if (gps->sat[i].eph == NULL)
			return 0;
	}
	gps->max_eph_count = max_eph_count;

	// observation types
	gps->obs_types = NULL;
	gps->obs_count = 0;

	// validity flags
	gps->iono_valid = 0;
	gps->clock_corr_valid = 0;

	return 1;
}